

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_f16c.cpp
# Opt level: O0

void ncnn::innerproduct_transform_kernel_fp16s_sse_f16c
               (Mat *weight_data,Mat *weight_data_tm,int num_input,int num_output,Option *opt)

{
  Option *in_stack_000005a0;
  int in_stack_000005a8;
  int in_stack_000005ac;
  Mat *in_stack_000005b0;
  Mat *in_stack_000005b8;
  
  innerproduct_transform_kernel_fp16s_sse
            (in_stack_000005b8,in_stack_000005b0,in_stack_000005ac,in_stack_000005a8,
             in_stack_000005a0);
  return;
}

Assistant:

void innerproduct_transform_kernel_fp16s_sse_f16c(const Mat& weight_data, Mat& weight_data_tm, int num_input, int num_output, const Option& opt)
{
    innerproduct_transform_kernel_fp16s_sse(weight_data, weight_data_tm, num_input, num_output, opt);
}